

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  archive_string *as;
  mtree_entry *pmVar1;
  mtree_entry *q;
  mtree_entry *p;
  mtree *mtree;
  archive_read *a_local;
  
  as = (archive_string *)**(undefined8 **)(ctx + 0x9a8);
  q = (mtree_entry *)as[2].buffer_length;
  while (q != (mtree_entry *)0x0) {
    pmVar1 = q->next;
    free(q->name);
    free_options(q->options);
    free(q);
    q = pmVar1;
  }
  archive_string_free(as);
  archive_string_free((archive_string *)&as[3].length);
  archive_string_free((archive_string *)&as[4].length);
  archive_entry_linkresolver_free((archive_entry_linkresolver *)as[5].length);
  free((void *)as[1].length);
  free(as);
  **(undefined8 **)(ctx + 0x9a8) = 0;
  return;
}

Assistant:

static int
cleanup(struct archive_read *a)
{
	struct mtree *mtree;
	struct mtree_entry *p, *q;

	mtree = (struct mtree *)(a->format->data);

	p = mtree->entries;
	while (p != NULL) {
		q = p->next;
		free(p->name);
		free_options(p->options);
		free(p);
		p = q;
	}
	archive_string_free(&mtree->line);
	archive_string_free(&mtree->current_dir);
	archive_string_free(&mtree->contents_name);
	archive_entry_linkresolver_free(mtree->resolver);

	free(mtree->buff);
	free(mtree);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}